

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

void __thiscall QMainWindowLayout::addToolBarBreak(QMainWindowLayout *this,ToolBarArea area)

{
  DockPosition DVar1;
  
  if (area == LeftToolBarArea) {
    DVar1 = LeftDock;
  }
  else if (area == BottomToolBarArea) {
    DVar1 = BottomDock;
  }
  else if (area == RightToolBarArea) {
    DVar1 = RightDock;
  }
  else {
    DVar1 = TopDock;
    area = TopToolBarArea;
  }
  QToolBarAreaLayout::addToolBarBreak((QToolBarAreaLayout *)(this + 0xa0),DVar1);
  if ((*(int *)(this + 0x3c0) <= *(int *)(this + 0x3c8)) &&
     (*(int *)(this + 0x3c4) <= *(int *)(this + 0x3cc))) {
    DVar1 = DockCount;
    if (area - LeftToolBarArea < 8) {
      DVar1 = *(DockPosition *)(&DAT_006d9c70 + (ulong)(area - LeftToolBarArea) * 4);
    }
    QToolBarAreaLayout::addToolBarBreak((QToolBarAreaLayout *)(this + 0x3d8),DVar1);
  }
  (**(code **)(*(long *)this + 0x70))(this);
  return;
}

Assistant:

void QMainWindowLayout::addToolBarBreak(Qt::ToolBarArea area)
{
    area = validateToolBarArea(area);

    layoutState.toolBarAreaLayout.addToolBarBreak(toDockPos(area));
    if (savedState.isValid())
        savedState.toolBarAreaLayout.addToolBarBreak(toDockPos(area));

    invalidate();
}